

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::i32_Trunc_f32s(w3Interp *this)

{
  float *pfVar1;
  w3Interp *this_local;
  
  pfVar1 = w3Stack::f32(&this->super_w3Stack);
  w3Stack::set_i32(&this->super_w3Stack,(int)*pfVar1);
  return;
}

Assistant:

INTERP (i32_Trunc_f32s)
{
    set_i32 ((int32_t)f32 ());
}